

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdirlisting.cpp
# Opt level: O2

void __thiscall QDirListingPrivate::advance(QDirListingPrivate *this)

{
  QAbstractFileEngineIterator *pQVar1;
  bool bVar2;
  int iVar3;
  reference pvVar4;
  reference pvVar5;
  long in_FS_OFFSET;
  QDirEntryInfo entryInfo;
  QDirEntryInfo local_138;
  undefined1 local_b8 [56];
  undefined1 *puStack_80;
  undefined1 *local_78;
  undefined1 *puStack_70;
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  undefined1 *puStack_50;
  _Storage<QFileInfo,_false> local_48;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->engine)._M_t.
      super___uniq_ptr_impl<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>._M_t.
      super__Tuple_impl<0UL,_QAbstractFileEngine_*,_std::default_delete<QAbstractFileEngine>_>.
      super__Head_base<0UL,_QAbstractFileEngine_*,_false>._M_head_impl == (QAbstractFileEngine *)0x0
     ) {
    local_48 = (_Storage<QFileInfo,_false>)&DAT_aaaaaaaaaaaaaaaa;
    puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
    local_58 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
    local_68 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
    local_78 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
    local_b8._48_8_ = &DAT_aaaaaaaaaaaaaaaa;
    puStack_80 = &DAT_aaaaaaaaaaaaaaaa;
    local_b8._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_b8._40_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_b8._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_b8._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_b8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_b8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QDirEntryInfo::QDirEntryInfo((QDirEntryInfo *)local_b8);
    while ((this->nativeIterators).
           super__Vector_base<std::unique_ptr<QFileSystemIterator,_std::default_delete<QFileSystemIterator>_>,_std::allocator<std::unique_ptr<QFileSystemIterator,_std::default_delete<QFileSystemIterator>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start !=
           (this->nativeIterators).
           super__Vector_base<std::unique_ptr<QFileSystemIterator,_std::default_delete<QFileSystemIterator>_>,_std::allocator<std::unique_ptr<QFileSystemIterator,_std::default_delete<QFileSystemIterator>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish) {
      while( true ) {
        pvVar5 = std::
                 vector<std::unique_ptr<QFileSystemIterator,_std::default_delete<QFileSystemIterator>_>,_std::allocator<std::unique_ptr<QFileSystemIterator,_std::default_delete<QFileSystemIterator>_>_>_>
                 ::back(&this->nativeIterators);
        bVar2 = QFileSystemIterator::advance
                          ((pvVar5->_M_t).
                           super___uniq_ptr_impl<QFileSystemIterator,_std::default_delete<QFileSystemIterator>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_QFileSystemIterator_*,_std::default_delete<QFileSystemIterator>_>
                           .super__Head_base<0UL,_QFileSystemIterator_*,_false>._M_head_impl,
                           (QFileSystemEntry *)local_b8,(QFileSystemMetaData *)&puStack_80);
        if (!bVar2) break;
        bVar2 = entryMatches(this,(QDirEntryInfo *)local_b8);
        if (bVar2) {
          QDirEntryInfo::operator=(&this->currentEntryInfo,(QDirEntryInfo *)local_b8);
          goto LAB_0021a5ca;
        }
        local_138.fileInfoOpt.super__Optional_base<QFileInfo,_false,_false>._M_payload.
        super__Optional_payload<QFileInfo,_true,_false,_false>.
        super__Optional_payload_base<QFileInfo>._M_payload = (_Storage<QFileInfo,_false>)0x0;
        local_138.fileInfoOpt.super__Optional_base<QFileInfo,_false,_false>._M_payload.
        super__Optional_payload<QFileInfo,_true,_false,_false>.
        super__Optional_payload_base<QFileInfo>._M_engaged = false;
        local_138.fileInfoOpt.super__Optional_base<QFileInfo,_false,_false>._M_payload.
        super__Optional_payload<QFileInfo,_true,_false,_false>.
        super__Optional_payload_base<QFileInfo>._9_7_ = 0;
        local_138.metaData.modificationTime_ = 0;
        local_138.metaData.userId_ = 0;
        local_138.metaData.groupId_ = 0;
        local_138.metaData.birthTime_ = 0;
        local_138.metaData.metadataChangeTime_ = 0;
        local_138.metaData.size_ = 0;
        local_138.metaData.accessTime_ = 0;
        local_138.entry.m_lastSeparator = 0;
        local_138.entry.m_firstDotInFileName = 0;
        local_138.entry.m_lastDotInFileName = 0;
        local_138.entry._54_2_ = 0;
        local_138.metaData.knownFlagsMask.
        super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
        super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i =
             (QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>)0x0;
        local_138.metaData.entryFlags.
        super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
        super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i =
             (QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>)0x0;
        local_138.entry.m_nativeFilePath.d.ptr = (char *)0x0;
        local_138.entry.m_nativeFilePath.d.size = 0;
        local_138.entry.m_filePath.d.size = 0;
        local_138.entry.m_nativeFilePath.d.d = (Data *)0x0;
        local_138.entry.m_filePath.d.d = (Data *)0x0;
        local_138.entry.m_filePath.d.ptr = (char16_t *)0x0;
        QDirEntryInfo::QDirEntryInfo(&local_138);
        QDirEntryInfo::operator=((QDirEntryInfo *)local_b8,&local_138);
        QDirEntryInfo::~QDirEntryInfo(&local_138);
      }
      std::
      vector<std::unique_ptr<QFileSystemIterator,_std::default_delete<QFileSystemIterator>_>,_std::allocator<std::unique_ptr<QFileSystemIterator,_std::default_delete<QFileSystemIterator>_>_>_>
      ::pop_back(&this->nativeIterators);
    }
LAB_0021a5ca:
    QDirEntryInfo::~QDirEntryInfo((QDirEntryInfo *)local_b8);
  }
  else {
    while ((this->fileEngineIterators).
           super__Vector_base<std::unique_ptr<QAbstractFileEngineIterator,_std::default_delete<QAbstractFileEngineIterator>_>,_std::allocator<std::unique_ptr<QAbstractFileEngineIterator,_std::default_delete<QAbstractFileEngineIterator>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start !=
           (this->fileEngineIterators).
           super__Vector_base<std::unique_ptr<QAbstractFileEngineIterator,_std::default_delete<QAbstractFileEngineIterator>_>,_std::allocator<std::unique_ptr<QAbstractFileEngineIterator,_std::default_delete<QAbstractFileEngineIterator>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish) {
      while( true ) {
        pvVar4 = std::
                 vector<std::unique_ptr<QAbstractFileEngineIterator,_std::default_delete<QAbstractFileEngineIterator>_>,_std::allocator<std::unique_ptr<QAbstractFileEngineIterator,_std::default_delete<QAbstractFileEngineIterator>_>_>_>
                 ::back(&this->fileEngineIterators);
        pQVar1 = (pvVar4->_M_t).
                 super___uniq_ptr_impl<QAbstractFileEngineIterator,_std::default_delete<QAbstractFileEngineIterator>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_QAbstractFileEngineIterator_*,_std::default_delete<QAbstractFileEngineIterator>_>
                 .super__Head_base<0UL,_QAbstractFileEngineIterator_*,_false>._M_head_impl;
        iVar3 = (*pQVar1->_vptr_QAbstractFileEngineIterator[2])(pQVar1);
        if ((char)iVar3 == '\0') break;
        local_48 = (_Storage<QFileInfo,_false>)&DAT_aaaaaaaaaaaaaaaa;
        puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
        local_58 = &DAT_aaaaaaaaaaaaaaaa;
        puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
        local_68 = &DAT_aaaaaaaaaaaaaaaa;
        puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
        local_78 = &DAT_aaaaaaaaaaaaaaaa;
        puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
        local_b8._48_8_ = &DAT_aaaaaaaaaaaaaaaa;
        puStack_80 = &DAT_aaaaaaaaaaaaaaaa;
        local_b8._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_b8._40_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_b8._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_b8._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_b8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_b8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        QDirEntryInfo::QDirEntryInfo((QDirEntryInfo *)local_b8);
        (*pQVar1->_vptr_QAbstractFileEngineIterator[4])(&local_138,pQVar1);
        std::optional<QFileInfo>::operator=
                  ((optional<QFileInfo> *)&local_48._M_value,(QFileInfo *)&local_138);
        QFileInfo::~QFileInfo((QFileInfo *)&local_138);
        bVar2 = entryMatches(this,(QDirEntryInfo *)local_b8);
        if (bVar2) {
          QDirEntryInfo::operator=(&this->currentEntryInfo,(QDirEntryInfo *)local_b8);
          goto LAB_0021a5ca;
        }
        QDirEntryInfo::~QDirEntryInfo((QDirEntryInfo *)local_b8);
      }
      std::
      vector<std::unique_ptr<QAbstractFileEngineIterator,_std::default_delete<QAbstractFileEngineIterator>_>,_std::allocator<std::unique_ptr<QAbstractFileEngineIterator,_std::default_delete<QAbstractFileEngineIterator>_>_>_>
      ::pop_back(&this->fileEngineIterators);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDirListingPrivate::advance()
{
    // Use get() in both code paths below because the iterator returned by back()
    // may be invalidated due to reallocation when appending new iterators in
    // pushDirectory().

    if (engine) {
        while (!fileEngineIterators.empty()) {
            // Find the next valid iterator that matches the filters.
            QAbstractFileEngineIterator *it;
            while (it = fileEngineIterators.back().get(), it->advance()) {
                QDirEntryInfo entryInfo;
                entryInfo.fileInfoOpt = it->currentFileInfo();
                if (entryMatches(entryInfo)) {
                    currentEntryInfo = std::move(entryInfo);
                    return;
                }
            }

            fileEngineIterators.pop_back();
        }
    } else {
#ifndef QT_NO_FILESYSTEMITERATOR
        QDirEntryInfo entryInfo;
        while (!nativeIterators.empty()) {
            // Find the next valid iterator that matches the filters.
            QFileSystemIterator *it;
            while (it = nativeIterators.back().get(),
                   it->advance(entryInfo.entry, entryInfo.metaData)) {
                if (entryMatches(entryInfo)) {
                    currentEntryInfo = std::move(entryInfo);
                    return;
                }
                entryInfo = {};
            }

            nativeIterators.pop_back();
        }
#endif
    }
}